

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall
VulkanHppGenerator::checkStructMemberCorrectness
          (VulkanHppGenerator *this,string *structureName,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *members,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *sTypeValues)

{
  string *psVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  pointer pbVar4;
  size_type sVar5;
  char *pcVar6;
  key_type *pkVar7;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *pvVar8;
  bool bVar9;
  int iVar10;
  const_iterator cVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  void *pvVar15;
  const_iterator cVar16;
  const_iterator cVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arraySize;
  _Base_ptr p_Var20;
  pointer __k;
  int iVar21;
  pointer pMVar22;
  _Base_ptr p_Var23;
  VulkanHppGenerator *pVVar24;
  VulkanHppGenerator *pVVar25;
  size_type sVar26;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar27;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [39];
  char local_181;
  pointer local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  string *local_b8;
  key_type *local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  VulkanHppGenerator *local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  VulkanHppGenerator *local_68;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_> *local_60;
  pointer local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
  *local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_b8 = structureName;
  local_78 = (_Base_ptr)sTypeValues;
  local_181 = isTypeUsed(this,structureName);
  pMVar22 = (members->
            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (members->
             super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar22 != local_58) {
    local_a0 = (_Base_ptr)&this->m_types;
    local_a8 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88 = (VulkanHppGenerator *)&this->m_enums;
    local_90 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = (VulkanHppGenerator *)&this->m_structs;
    local_70 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_50 = &this->m_constants;
    local_48 = &(this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = members;
    do {
      psVar1 = &(pMVar22->type).type;
      local_1c8._8_8_ = (pMVar22->type).type._M_dataplus._M_p;
      local_1c8._0_8_ = (pMVar22->type).type._M_string_length;
      pVVar24 = (VulkanHppGenerator *)local_1c8;
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,"Vk");
      local_b0 = psVar1;
      if (bVar9) {
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                         *)local_a0,psVar1);
        if (cVar11._M_node == local_a8) {
          __assert_fail("memberTypeIt != m_types.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4ea,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        p_Var23 = cVar11._M_node[3]._M_left;
        iVar10 = pMVar22->xmlLine;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,"struct member type <",psVar1);
        pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158,"> used in struct <");
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar12->_M_dataplus)._M_p;
        paVar18 = &pbVar12->field_2;
        if (paVar19 == paVar18) {
          local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
        }
        else {
          local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_178._M_dataplus._M_p = (pointer)paVar19;
        }
        local_178._M_string_length = pbVar12->_M_string_length;
        (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar12->_M_string_length = 0;
        (pbVar12->field_2)._M_local_buf[0] = '\0';
        pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_178,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length);
        local_1a8._0_8_ = local_1a8 + 0x10;
        p_Var20 = (_Base_ptr)(pbVar12->_M_dataplus)._M_p;
        paVar19 = &pbVar12->field_2;
        if (p_Var20 == (_Base_ptr)paVar19) {
          local_1a8._16_8_ = paVar19->_M_allocated_capacity;
          local_1a8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
        }
        else {
          local_1a8._16_8_ = paVar19->_M_allocated_capacity;
          local_1a8._0_8_ = p_Var20;
        }
        local_1a8._8_8_ = pbVar12->_M_string_length;
        (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
        pbVar12->_M_string_length = 0;
        (pbVar12->field_2)._M_local_buf[0] = '\0';
        pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"> is never required for any feature or extension");
        local_1c8._0_8_ = local_1c8 + 0x10;
        pcVar2 = (pbVar12->_M_dataplus)._M_p;
        paVar19 = &pbVar12->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar19) {
          local_1c8._16_8_ = paVar19->_M_allocated_capacity;
          local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
        }
        else {
          local_1c8._16_8_ = paVar19->_M_allocated_capacity;
          local_1c8._0_8_ = pcVar2;
        }
        local_1c8._8_8_ = pbVar12->_M_string_length;
        (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
        pbVar12->_M_string_length = 0;
        (pbVar12->field_2)._M_local_buf[0] = '\0';
        checkForError(p_Var23 != (_Base_ptr)0x0,iVar10,(string *)local_1c8);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          (ulong)(local_178.field_2._M_allocated_capacity + 1));
        }
        pVVar24 = (VulkanHppGenerator *)local_158._0_8_;
        if ((VulkanHppGenerator *)local_158._0_8_ != (VulkanHppGenerator *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
      }
      pvVar8 = local_60;
      local_180 = pMVar22;
      if ((pMVar22->selector)._M_string_length != 0) {
        cVar13 = findStructMemberIt(pVVar24,&pMVar22->selector,local_60);
        if (cVar13._M_current ==
            (pvVar8->
            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("selectorIt != members.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4f5,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        local_80 = (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                           *)local_88,&((cVar13._M_current)->type).type);
        if (local_80 == local_90) {
          __assert_fail("selectorEnumIt != m_enums.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4f7,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        pVVar24 = local_68;
        cVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                         *)local_68,local_b0);
        if ((cVar14._M_node == local_70) ||
           (*(char *)((long)&cVar14._M_node[3]._M_left + 2) == '\0')) {
          __assert_fail("( unionIt != m_structs.end() ) && unionIt->second.isUnion",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4f9,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        p_Var23 = cVar14._M_node[3]._M_right;
        local_40 = *(_Base_ptr *)(cVar14._M_node + 4);
        if (p_Var23 != local_40) {
          local_80 = (_Base_ptr)&local_80[5]._M_left;
          do {
            p_Var20 = p_Var23[9]._M_right;
            local_38 = *(_Base_ptr *)(p_Var23 + 10);
            if (p_Var20 == local_38) {
              __assert_fail("!unionMember.selection.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x4fd,
                            "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                           );
            }
            local_98 = p_Var23 + 4;
            do {
              bVar9 = contains(pVVar24,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                                        *)local_80,(string *)p_Var20);
              iVar10 = *(int *)&p_Var23[0xc]._M_left;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_118,"union member <",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98);
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_118,"> uses selection <");
              local_138._M_allocated_capacity = (size_type)&local_128;
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar12->_M_dataplus)._M_p;
              paVar18 = &pbVar12->field_2;
              if (paVar19 == paVar18) {
                local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_128._8_8_ = *(size_t *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_138._M_allocated_capacity = (size_type)paVar19;
              }
              local_138._8_8_ = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_138,*(char **)p_Var20,(size_type)p_Var20->_M_parent);
              local_158._0_8_ = local_158 + 0x10;
              pVVar24 = (VulkanHppGenerator *)(pbVar12->_M_dataplus)._M_p;
              paVar19 = &pbVar12->field_2;
              if (pVVar24 == (VulkanHppGenerator *)paVar19) {
                local_158._16_8_ = paVar19->_M_allocated_capacity;
                local_158._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_158._16_8_ = paVar19->_M_allocated_capacity;
                local_158._0_8_ = pVVar24;
              }
              local_158._8_8_ = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_158,"> that is not part of the selector type <");
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar12->_M_dataplus)._M_p;
              paVar18 = &pbVar12->field_2;
              if (paVar19 == paVar18) {
                local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_178._M_dataplus._M_p = (pointer)paVar19;
              }
              local_178._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_178,((cVar13._M_current)->type).type._M_dataplus._M_p,
                                   ((cVar13._M_current)->type).type._M_string_length);
              local_1a8._0_8_ = local_1a8 + 0x10;
              p_Var3 = (_Base_ptr)(pbVar12->_M_dataplus)._M_p;
              paVar19 = &pbVar12->field_2;
              if (p_Var3 == (_Base_ptr)paVar19) {
                local_1a8._16_8_ = paVar19->_M_allocated_capacity;
                local_1a8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_1a8._16_8_ = paVar19->_M_allocated_capacity;
                local_1a8._0_8_ = p_Var3;
              }
              local_1a8._8_8_ = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a8,">");
              local_1c8._0_8_ = local_1c8 + 0x10;
              pcVar2 = (pbVar12->_M_dataplus)._M_p;
              paVar19 = &pbVar12->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 == paVar19) {
                local_1c8._16_8_ = paVar19->_M_allocated_capacity;
                local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              }
              else {
                local_1c8._16_8_ = paVar19->_M_allocated_capacity;
                local_1c8._0_8_ = pcVar2;
              }
              local_1c8._8_8_ = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
              pbVar12->_M_string_length = 0;
              (pbVar12->field_2)._M_local_buf[0] = '\0';
              checkForError(bVar9,iVar10,(string *)local_1c8);
              if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
              }
              if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                (ulong)(local_178.field_2._M_allocated_capacity + 1));
              }
              if ((VulkanHppGenerator *)local_158._0_8_ != (VulkanHppGenerator *)(local_158 + 0x10))
              {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_allocated_capacity != &local_128) {
                operator_delete((void *)local_138._M_allocated_capacity,
                                (ulong)(local_128._M_allocated_capacity + 1));
              }
              pVVar24 = (VulkanHppGenerator *)local_118._0_8_;
              if ((VulkanHppGenerator *)local_118._0_8_ != (VulkanHppGenerator *)(local_118 + 0x10))
              {
                operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
              }
              p_Var20 = p_Var20 + 1;
            } while (p_Var20 != local_38);
            p_Var23 = (_Base_ptr)&p_Var23[0xc]._M_right;
          } while (p_Var23 != local_40);
        }
      }
      pkVar7 = local_b0;
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                       *)local_a0,local_b0);
      pMVar22 = local_180;
      iVar10 = local_180->xmlLine;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "struct member uses unknown type <",pkVar7);
      pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,">");
      local_1c8._0_8_ = local_1c8 + 0x10;
      pcVar2 = (pbVar12->_M_dataplus)._M_p;
      paVar19 = &pbVar12->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar19) {
        local_1c8._16_8_ = paVar19->_M_allocated_capacity;
        local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
      }
      else {
        local_1c8._16_8_ = paVar19->_M_allocated_capacity;
        local_1c8._0_8_ = pcVar2;
      }
      local_1c8._8_8_ = pbVar12->_M_string_length;
      (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
      pbVar12->_M_string_length = 0;
      (pbVar12->field_2)._M_local_buf[0] = '\0';
      checkForError(cVar11._M_node != local_a8,iVar10,(string *)local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      pbVar4 = (pMVar22->arraySizes).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (pMVar22->arraySizes).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pkVar7 = local_b0, __k != pbVar4;
          __k = __k + 1) {
        sVar5 = __k->_M_string_length;
        if (sVar5 != 0) {
          pcVar2 = (__k->_M_dataplus)._M_p;
          sVar26 = 0;
          do {
            pvVar15 = memchr("0123456789",(int)pcVar2[sVar26],10);
            if (pvVar15 == (void *)0x0) goto LAB_001395b4;
            sVar26 = sVar26 + 1;
          } while (sVar5 != sVar26);
          sVar26 = 0xffffffffffffffff;
LAB_001395b4:
          if ((sVar26 != 0xffffffffffffffff) &&
             (cVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                       ::find(&local_50->_M_t,__k), cVar16._M_node == local_48)) {
            cVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                             *)local_a0,__k);
            if (cVar11._M_node == local_a8) {
LAB_00139664:
              bVar9 = false;
            }
            else {
              sVar5 = __k->_M_string_length;
              bVar9 = sVar5 == 0;
              local_98 = (_Base_ptr)cVar11;
              if (bVar9) {
LAB_00139649:
                pMVar22 = local_180;
                if (!bVar9) goto LAB_00139664;
                bVar9 = local_98[2]._M_color == 5;
              }
              else {
                pcVar6 = (__k->_M_dataplus)._M_p;
                iVar21 = (int)*pcVar6;
                iVar10 = toupper(iVar21);
                if (iVar10 == iVar21) {
                  sVar26 = 1;
                  do {
                    bVar9 = sVar5 == sVar26;
                    if (bVar9) goto LAB_00139649;
                    iVar21 = (int)pcVar6[sVar26];
                    iVar10 = toupper(iVar21);
                    sVar26 = sVar26 + 1;
                  } while (iVar10 == iVar21);
                }
                bVar9 = false;
                pMVar22 = local_180;
              }
            }
            iVar10 = pMVar22->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"struct member array size uses unknown constant <",__k);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,">");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar19) {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            checkForError(bVar9,iVar10,(string *)local_1c8);
            pMVar22 = local_180;
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
              operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
            }
          }
        }
      }
      pVVar24 = (VulkanHppGenerator *)(local_118 + 0x10);
      if ((pMVar22->value)._M_string_length != 0) {
        psVar1 = &pMVar22->value;
        pVVar25 = local_88;
        cVar17 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                         *)local_88,local_b0);
        if (cVar17._M_node == local_90) {
          iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(pkVar7,"uint32_t");
          if (iVar10 == 0) {
            sVar5 = (pMVar22->value)._M_string_length;
            if (sVar5 == 0) {
              bVar9 = true;
            }
            else {
              pcVar2 = (psVar1->_M_dataplus)._M_p;
              sVar26 = 0;
              do {
                pvVar15 = memchr("0123456789",(int)pcVar2[sVar26],10);
                if (pvVar15 == (void *)0x0) goto LAB_001398b1;
                sVar26 = sVar26 + 1;
              } while (sVar5 != sVar26);
              sVar26 = 0xffffffffffffffff;
LAB_001398b1:
              bVar9 = sVar26 == 0xffffffffffffffff;
            }
            iVar10 = local_180->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8,"value <",psVar1);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8,"> for member <");
            local_f8._M_allocated_capacity = (size_type)(pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_allocated_capacity == paVar19) {
              local_e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
              local_e8._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_f8._M_allocated_capacity = (size_type)&local_e8;
            }
            else {
              local_e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
            }
            local_f8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_f8,(local_180->name)._M_dataplus._M_p,
                                 (local_180->name)._M_string_length);
            local_118._0_8_ = (pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._0_8_ == paVar19) {
              local_118._16_8_ = paVar19->_M_allocated_capacity;
              local_118._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_118._0_8_ = (VulkanHppGenerator *)(local_118 + 0x10);
            }
            else {
              local_118._16_8_ = paVar19->_M_allocated_capacity;
            }
            local_118._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_118,"> in structure <");
            local_138._M_allocated_capacity = (size_type)&local_128;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar12->_M_dataplus)._M_p;
            paVar18 = &pbVar12->field_2;
            if (paVar19 == paVar18) {
              local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_128._8_8_ = *(size_t *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_138._M_allocated_capacity = (size_type)paVar19;
            }
            local_138._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_138,(local_b8->_M_dataplus)._M_p,
                                 local_b8->_M_string_length);
            local_158._0_8_ = local_158 + 0x10;
            pVVar24 = (VulkanHppGenerator *)(pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if (pVVar24 == (VulkanHppGenerator *)paVar19) {
              local_158._16_8_ = paVar19->_M_allocated_capacity;
              local_158._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_158._16_8_ = paVar19->_M_allocated_capacity;
              local_158._0_8_ = pVVar24;
            }
            local_158._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_158,"> of type <");
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar12->_M_dataplus)._M_p;
            paVar18 = &pbVar12->field_2;
            if (paVar19 == paVar18) {
              local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_178._M_dataplus._M_p = (pointer)paVar19;
            }
            local_178._M_string_length = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_178,(local_180->type).type._M_dataplus._M_p,
                                 (local_180->type).type._M_string_length);
            local_1a8._0_8_ = local_1a8 + 0x10;
            p_Var23 = (_Base_ptr)(pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if (p_Var23 == (_Base_ptr)paVar19) {
              local_1a8._16_8_ = paVar19->_M_allocated_capacity;
              local_1a8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1a8._16_8_ = paVar19->_M_allocated_capacity;
              local_1a8._0_8_ = p_Var23;
            }
            local_1a8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,"> is not a number");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar19) {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            checkForError(bVar9,iVar10,(string *)local_1c8);
            pMVar22 = local_180;
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) goto LAB_00139f3f;
          }
          else {
            iVar10 = pMVar22->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8,"member <",&pMVar22->name);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8,"> in structure <");
            local_f8._M_allocated_capacity = (size_type)(pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_allocated_capacity == paVar19) {
              local_e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
              local_e8._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_f8._M_allocated_capacity = (size_type)&local_e8;
            }
            else {
              local_e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
            }
            local_f8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_f8,(local_b8->_M_dataplus)._M_p,
                                 local_b8->_M_string_length);
            local_118._0_8_ = (pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._0_8_ == paVar19) {
              local_118._16_8_ = paVar19->_M_allocated_capacity;
              local_118._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_118._0_8_ = pVVar24;
            }
            else {
              local_118._16_8_ = paVar19->_M_allocated_capacity;
            }
            local_118._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_118,"> holds value <");
            local_138._M_allocated_capacity = (size_type)&local_128;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar12->_M_dataplus)._M_p;
            paVar18 = &pbVar12->field_2;
            if (paVar19 == paVar18) {
              local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_128._8_8_ = *(size_t *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_138._M_allocated_capacity = (size_type)paVar19;
            }
            local_138._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_138,(pMVar22->value)._M_dataplus._M_p,
                                 (pMVar22->value)._M_string_length);
            local_158._0_8_ = local_158 + 0x10;
            pVVar24 = (VulkanHppGenerator *)(pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if (pVVar24 == (VulkanHppGenerator *)paVar19) {
              local_158._16_8_ = paVar19->_M_allocated_capacity;
              local_158._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_158._16_8_ = paVar19->_M_allocated_capacity;
              local_158._0_8_ = pVVar24;
            }
            local_158._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_158,"> for an unhandled type <");
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar12->_M_dataplus)._M_p;
            paVar18 = &pbVar12->field_2;
            if (paVar19 == paVar18) {
              local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_178._M_dataplus._M_p = (pointer)paVar19;
            }
            local_178._M_string_length = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_178,(pMVar22->type).type._M_dataplus._M_p,
                                 (pMVar22->type).type._M_string_length);
            local_1a8._0_8_ = local_1a8 + 0x10;
            p_Var23 = (_Base_ptr)(pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if (p_Var23 == (_Base_ptr)paVar19) {
              local_1a8._16_8_ = paVar19->_M_allocated_capacity;
              local_1a8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1a8._16_8_ = paVar19->_M_allocated_capacity;
              local_1a8._0_8_ = p_Var23;
            }
            local_1a8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,">");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar19) {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            checkForError(false,iVar10,(string *)local_1c8);
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
LAB_00139f3f:
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
          }
          if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            (ulong)(local_178.field_2._M_allocated_capacity + 1));
          }
          if ((VulkanHppGenerator *)local_158._0_8_ != (VulkanHppGenerator *)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_allocated_capacity != &local_128) {
            operator_delete((void *)local_138._M_allocated_capacity,
                            (ulong)(local_128._M_allocated_capacity + 1));
          }
          if ((VulkanHppGenerator *)local_118._0_8_ != (VulkanHppGenerator *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_allocated_capacity != &local_e8) {
            operator_delete((void *)local_f8._M_allocated_capacity,
                            local_e8._M_allocated_capacity + 1);
          }
          p_Var23 = (_Base_ptr)local_d8._16_8_;
          p_Var20 = (_Base_ptr)local_d8._0_8_;
          if ((_Base_ptr)local_d8._0_8_ != (_Base_ptr)(local_d8 + 0x10)) {
LAB_0013a38d:
            operator_delete(p_Var20,(ulong)((long)&p_Var23->_M_color + 1));
          }
        }
        else if (local_181 != '\0') {
          bVar9 = contains(pVVar25,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                                    *)&cVar17._M_node[5]._M_left,psVar1);
          iVar10 = pMVar22->xmlLine;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8,"value <",psVar1);
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,"> for member <");
          local_f8._M_allocated_capacity = (size_type)(pbVar12->_M_dataplus)._M_p;
          paVar19 = &pbVar12->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_allocated_capacity == paVar19) {
            local_e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_e8._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            local_f8._M_allocated_capacity = (size_type)&local_e8;
          }
          else {
            local_e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
          }
          local_f8._8_8_ = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_f8,(local_180->name)._M_dataplus._M_p,
                                (local_180->name)._M_string_length);
          local_118._0_8_ = (pbVar12->_M_dataplus)._M_p;
          paVar19 = &pbVar12->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._0_8_ == paVar19) {
            local_118._16_8_ = paVar19->_M_allocated_capacity;
            local_118._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            local_118._0_8_ = pVVar24;
          }
          else {
            local_118._16_8_ = paVar19->_M_allocated_capacity;
          }
          local_118._8_8_ = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_118,"> in structure <");
          local_138._M_allocated_capacity = (size_type)&local_128;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar12->_M_dataplus)._M_p;
          paVar18 = &pbVar12->field_2;
          if (paVar19 == paVar18) {
            local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_128._8_8_ = *(size_t *)((long)&pbVar12->field_2 + 8);
          }
          else {
            local_128._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_138._M_allocated_capacity = (size_type)paVar19;
          }
          local_138._8_8_ = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_138,(local_b8->_M_dataplus)._M_p,local_b8->_M_string_length)
          ;
          local_158._0_8_ = local_158 + 0x10;
          pVVar25 = (VulkanHppGenerator *)(pbVar12->_M_dataplus)._M_p;
          paVar19 = &pbVar12->field_2;
          if (pVVar25 == (VulkanHppGenerator *)paVar19) {
            local_158._16_8_ = paVar19->_M_allocated_capacity;
            local_158._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
          }
          else {
            local_158._16_8_ = paVar19->_M_allocated_capacity;
            local_158._0_8_ = pVVar25;
          }
          local_158._8_8_ = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_158,"> of enum type <");
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar12->_M_dataplus)._M_p;
          paVar18 = &pbVar12->field_2;
          if (paVar19 == paVar18) {
            local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
          }
          else {
            local_178.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_178._M_dataplus._M_p = (pointer)paVar19;
          }
          local_178._M_string_length = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_178,(local_180->type).type._M_dataplus._M_p,
                                (local_180->type).type._M_string_length);
          local_1a8._0_8_ = local_1a8 + 0x10;
          p_Var23 = (_Base_ptr)(pbVar12->_M_dataplus)._M_p;
          paVar19 = &pbVar12->field_2;
          if (p_Var23 == (_Base_ptr)paVar19) {
            local_1a8._16_8_ = paVar19->_M_allocated_capacity;
            local_1a8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
          }
          else {
            local_1a8._16_8_ = paVar19->_M_allocated_capacity;
            local_1a8._0_8_ = p_Var23;
          }
          local_1a8._8_8_ = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8,"> not listed");
          local_1c8._0_8_ = local_1c8 + 0x10;
          pcVar2 = (pbVar12->_M_dataplus)._M_p;
          paVar19 = &pbVar12->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 == paVar19) {
            local_1c8._16_8_ = paVar19->_M_allocated_capacity;
            local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
          }
          else {
            local_1c8._16_8_ = paVar19->_M_allocated_capacity;
            local_1c8._0_8_ = pcVar2;
          }
          local_1c8._8_8_ = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar12->_M_string_length = 0;
          (pbVar12->field_2)._M_local_buf[0] = '\0';
          checkForError(bVar9,iVar10,(string *)local_1c8);
          pMVar22 = local_180;
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            (ulong)(local_178.field_2._M_allocated_capacity + 1));
          }
          if ((VulkanHppGenerator *)local_158._0_8_ != (VulkanHppGenerator *)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_allocated_capacity != &local_128) {
            operator_delete((void *)local_138._M_allocated_capacity,
                            (ulong)(local_128._M_allocated_capacity + 1));
          }
          if ((VulkanHppGenerator *)local_118._0_8_ != pVVar24) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_allocated_capacity != &local_e8) {
            operator_delete((void *)local_f8._M_allocated_capacity,
                            local_e8._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)local_d8._0_8_ != (_Base_ptr)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&pMVar22->name,"sType");
          if (iVar10 == 0) {
            pVar27 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_78,psVar1);
            iVar10 = pMVar22->xmlLine;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"sType value <",psVar1);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8,"> has been used before");
            local_1c8._0_8_ = local_1c8 + 0x10;
            pcVar2 = (pbVar12->_M_dataplus)._M_p;
            paVar19 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 == paVar19) {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            }
            else {
              local_1c8._16_8_ = paVar19->_M_allocated_capacity;
              local_1c8._0_8_ = pcVar2;
            }
            local_1c8._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar19;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            checkForError((bool)(pVar27.second & 1),iVar10,(string *)local_1c8);
            pMVar22 = local_180;
            if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            p_Var23 = (_Base_ptr)local_1a8._16_8_;
            p_Var20 = (_Base_ptr)local_1a8._0_8_;
            if ((_Base_ptr)local_1a8._0_8_ != (_Base_ptr)(local_1a8 + 0x10)) goto LAB_0013a38d;
          }
        }
      }
      pMVar22 = pMVar22 + 1;
    } while (pMVar22 != local_58);
  }
  return;
}

Assistant:

void VulkanHppGenerator::checkStructMemberCorrectness( std::string const &             structureName,
                                                       std::vector<MemberData> const & members,
                                                       std::set<std::string> &         sTypeValues ) const
{
  // determine if this struct is requird/used
  const bool structUsed = isTypeUsed( structureName );

  for ( auto const & member : members )
  {
    // check that all member types are required in some feature or extension
    if ( member.type.type.starts_with( "Vk" ) )
    {
      auto memberTypeIt = m_types.find( member.type.type );
      assert( memberTypeIt != m_types.end() );
      checkForError( !memberTypeIt->second.requiredBy.empty(),
                     member.xmlLine,
                     "struct member type <" + member.type.type + "> used in struct <" + structureName + "> is never required for any feature or extension" );
    }

    // if a member specifies a selector, that member is a union and the selector is an enum
    // check that there's a 1-1 connection between the specified selections and the values of that enum
    if ( !member.selector.empty() )
    {
      auto selectorIt = findStructMemberIt( member.selector, members );
      assert( selectorIt != members.end() );
      auto selectorEnumIt = m_enums.find( selectorIt->type.type );
      assert( selectorEnumIt != m_enums.end() );
      auto unionIt = m_structs.find( member.type.type );
      assert( ( unionIt != m_structs.end() ) && unionIt->second.isUnion );
      for ( auto const & unionMember : unionIt->second.members )
      {
        // check that each union member has a selection, that is a value of the seleting enum
        assert( !unionMember.selection.empty() );
        for ( auto const & selection : unionMember.selection )
        {
          checkForError( contains( selectorEnumIt->second.values, selection ),
                         unionMember.xmlLine,
                         "union member <" + unionMember.name + "> uses selection <" + selection + "> that is not part of the selector type <" +
                           selectorIt->type.type + ">" );
        }
      }
    }

    // check that each member type is known
    checkForError( m_types.contains( member.type.type ), member.xmlLine, "struct member uses unknown type <" + member.type.type + ">" );

    // check that any used constant is a known constant or some potentially externally defined constant
    for ( auto const & arraySize : member.arraySizes )
    {
      if ( !isNumber( arraySize ) && !m_constants.contains( arraySize ) )
      {
        auto typeIt = m_types.find( arraySize );
        checkForError( ( typeIt != m_types.end() ) && isAllUpper( arraySize ) && ( typeIt->second.category == TypeCategory::ExternalType ),
                       member.xmlLine,
                       "struct member array size uses unknown constant <" + arraySize + ">" );
      }
    }

    // checks if a value is specified
    if ( !member.value.empty() )
    {
      auto enumIt = m_enums.find( member.type.type );
      if ( enumIt != m_enums.end() )
      {
        // check that the value exists in the specified enum (if the struct is used at all)
        if ( structUsed )
        {
          checkForError( contains( enumIt->second.values, member.value ),
                         member.xmlLine,
                         "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of enum type <" +
                           member.type.type + "> not listed" );
          // special handling for sType: no value should appear more than once
          if ( member.name == "sType" )
          {
            checkForError( sTypeValues.insert( member.value ).second, member.xmlLine, "sType value <" + member.value + "> has been used before" );
          }
        }
      }
      else if ( member.type.type == "uint32_t" )
      {
        checkForError( isNumber( member.value ),
                       member.xmlLine,
                       "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of type <" + member.type.type +
                         "> is not a number" );
      }
      else
      {
        // don't know the type of the value -> error out
        checkForError( false,
                       member.xmlLine,
                       "member <" + member.name + "> in structure <" + structureName + "> holds value <" + member.value + "> for an unhandled type <" +
                         member.type.type + ">" );
      }
    }
  }
}